

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O0

void lock_spinlock(int *spinlock)

{
  int iVar1;
  undefined4 local_14;
  int count;
  int *spinlock_local;
  
  local_14 = 0;
  while( true ) {
    LOCK();
    iVar1 = *spinlock;
    if (iVar1 == 0) {
      *spinlock = 1;
    }
    UNLOCK();
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
    if (local_14 % 10 == 0) {
      sleep(0);
    }
  }
  return;
}

Assistant:

inline static void lock_spinlock(volatile int *spinlock)
{
	int count = 0;
	// Set the spin lock value to 1 if it is 0.
	while(!__sync_bool_compare_and_swap(spinlock, 0, 1))
	{
		count++;
		if (0 == count % 10)
		{
			// If it is already 1, let another thread play with the CPU for a
			// bit then try again.
			sleep(0);
		}
	}
}